

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

void newenv(void)

{
  _Rb_tree_header *p_Var1;
  Env *pEVar2;
  
  pEVar2 = (Env *)operator_new(0x68);
  p_Var1 = &(pEVar2->var_table)._M_t._M_impl.super__Rb_tree_header;
  (pEVar2->var_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pEVar2->var_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pEVar2->var_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pEVar2->var_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pEVar2->var_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pEVar2->func_table)._M_t._M_impl.super__Rb_tree_header;
  (pEVar2->func_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pEVar2->func_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pEVar2->func_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pEVar2->func_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pEVar2->func_table)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pEVar2->pre = current;
  current = pEVar2;
  return;
}

Assistant:

void newenv() {
    current = new Env(current);
}